

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.cpp
# Opt level: O2

GdlFeatureSetting * __thiscall GdlFeatureDefn::FindSetting(GdlFeatureDefn *this,string *sta)

{
  pointer ppGVar1;
  __type _Var2;
  size_t i;
  ulong uVar3;
  
  uVar3 = 0;
  while( true ) {
    ppGVar1 = (this->m_vpfset).
              super__Vector_base<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_vpfset).
                      super__Vector_base<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3) <= uVar3) {
      return (GdlFeatureSetting *)0x0;
    }
    _Var2 = std::operator==(&ppGVar1[uVar3]->m_staName,sta);
    if (_Var2) break;
    uVar3 = uVar3 + 1;
  }
  return (this->m_vpfset).
         super__Vector_base<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>._M_impl.
         super__Vector_impl_data._M_start[uVar3];
}

Assistant:

GdlFeatureSetting * GdlFeatureDefn::FindSetting(std::string sta)
{
	for (size_t i = 0; i < m_vpfset.size(); ++i)
	{
		if (m_vpfset[i]->m_staName == sta)
			return m_vpfset[i];
	}
	return NULL;
}